

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018def0 = 0x2d2d2d2d2d2d2d;
    uRam000000000018def7._0_1_ = '-';
    uRam000000000018def7._1_1_ = '-';
    uRam000000000018def7._2_1_ = '-';
    uRam000000000018def7._3_1_ = '-';
    uRam000000000018def7._4_1_ = '-';
    uRam000000000018def7._5_1_ = '-';
    uRam000000000018def7._6_1_ = '-';
    uRam000000000018def7._7_1_ = '-';
    DAT_0018dee0 = '-';
    DAT_0018dee0_1._0_1_ = '-';
    DAT_0018dee0_1._1_1_ = '-';
    DAT_0018dee0_1._2_1_ = '-';
    DAT_0018dee0_1._3_1_ = '-';
    DAT_0018dee0_1._4_1_ = '-';
    DAT_0018dee0_1._5_1_ = '-';
    DAT_0018dee0_1._6_1_ = '-';
    uRam000000000018dee8 = 0x2d2d2d2d2d2d2d;
    DAT_0018deef = 0x2d;
    DAT_0018ded0 = '-';
    DAT_0018ded0_1._0_1_ = '-';
    DAT_0018ded0_1._1_1_ = '-';
    DAT_0018ded0_1._2_1_ = '-';
    DAT_0018ded0_1._3_1_ = '-';
    DAT_0018ded0_1._4_1_ = '-';
    DAT_0018ded0_1._5_1_ = '-';
    DAT_0018ded0_1._6_1_ = '-';
    uRam000000000018ded8._0_1_ = '-';
    uRam000000000018ded8._1_1_ = '-';
    uRam000000000018ded8._2_1_ = '-';
    uRam000000000018ded8._3_1_ = '-';
    uRam000000000018ded8._4_1_ = '-';
    uRam000000000018ded8._5_1_ = '-';
    uRam000000000018ded8._6_1_ = '-';
    uRam000000000018ded8._7_1_ = '-';
    DAT_0018dec0 = '-';
    DAT_0018dec0_1._0_1_ = '-';
    DAT_0018dec0_1._1_1_ = '-';
    DAT_0018dec0_1._2_1_ = '-';
    DAT_0018dec0_1._3_1_ = '-';
    DAT_0018dec0_1._4_1_ = '-';
    DAT_0018dec0_1._5_1_ = '-';
    DAT_0018dec0_1._6_1_ = '-';
    uRam000000000018dec8._0_1_ = '-';
    uRam000000000018dec8._1_1_ = '-';
    uRam000000000018dec8._2_1_ = '-';
    uRam000000000018dec8._3_1_ = '-';
    uRam000000000018dec8._4_1_ = '-';
    uRam000000000018dec8._5_1_ = '-';
    uRam000000000018dec8._6_1_ = '-';
    uRam000000000018dec8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018deb8._0_1_ = '-';
    uRam000000000018deb8._1_1_ = '-';
    uRam000000000018deb8._2_1_ = '-';
    uRam000000000018deb8._3_1_ = '-';
    uRam000000000018deb8._4_1_ = '-';
    uRam000000000018deb8._5_1_ = '-';
    uRam000000000018deb8._6_1_ = '-';
    uRam000000000018deb8._7_1_ = '-';
    DAT_0018deff = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}